

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

Fad<long_double> * __thiscall
TPZFMatrix<Fad<long_double>_>::GetVal
          (Fad<long_double> *__return_storage_ptr__,TPZFMatrix<Fad<long_double>_> *this,int64_t row,
          int64_t col)

{
  uint uVar1;
  Fad<long_double> *pFVar2;
  MEM_CPY<long_double> *this_00;
  long lVar3;
  ulong uVar4;
  
  lVar3 = col * (this->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow;
  pFVar2 = this->fElem;
  __return_storage_ptr__->val_ = pFVar2[lVar3 + row].val_;
  uVar1 = pFVar2[lVar3 + row].dx_.num_elts;
  (__return_storage_ptr__->dx_).num_elts = uVar1;
  (__return_storage_ptr__->dx_).ptr_to_data = (longdouble *)0x0;
  if ((long)(int)uVar1 != 0) {
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar4 = (long)(int)uVar1 << 4;
    }
    this_00 = (MEM_CPY<long_double> *)operator_new__(uVar4);
    (__return_storage_ptr__->dx_).ptr_to_data = (longdouble *)this_00;
    MEM_CPY<long_double>::copy
              (this_00,(EVP_PKEY_CTX *)pFVar2[lVar3 + row].dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar1);
  }
  __return_storage_ptr__->defaultVal = pFVar2[lVar3 + row].defaultVal;
  return __return_storage_ptr__;
}

Assistant:

inline const TVar TPZFMatrix<TVar>::GetVal( const int64_t row, const int64_t col ) const {
    return( fElem[ col*this->fRow + row ] );
}